

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

void __thiscall
clickhouse::ColumnVector<double>::Append(ColumnVector<double> *this,ColumnRef *column)

{
  bool bVar1;
  iterator __first;
  iterator __last;
  iterator this_00;
  Column *in_RSI;
  shared_ptr<clickhouse::ColumnVector<double>_> col;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff78;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffff80;
  const_iterator in_stack_ffffffffffffffd8;
  __shared_ptr local_20 [32];
  
  std::__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x21a023);
  Column::As<clickhouse::ColumnVector<double>>(in_RSI);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_20);
  if (bVar1) {
    __first = std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff78);
    __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
    __normal_iterator<double*>
              (in_stack_ffffffffffffff80,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
               in_stack_ffffffffffffff78);
    std::
    __shared_ptr_access<clickhouse::ColumnVector<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<clickhouse::ColumnVector<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x21a079);
    __last = std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff78);
    std::
    __shared_ptr_access<clickhouse::ColumnVector<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<clickhouse::ColumnVector<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x21a094);
    this_00 = std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff78);
    std::vector<double,std::allocator<double>>::
    insert<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,void>
              ((vector<double,_std::allocator<double>_> *)this_00._M_current,
               in_stack_ffffffffffffffd8,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               __first._M_current,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               __last._M_current);
  }
  std::shared_ptr<clickhouse::ColumnVector<double>_>::~shared_ptr
            ((shared_ptr<clickhouse::ColumnVector<double>_> *)0x21a0f5);
  return;
}

Assistant:

void ColumnVector<T>::Append(ColumnRef column) {
    if (auto col = column->As<ColumnVector<T>>()) {
        data_.insert(data_.end(), col->data_.begin(), col->data_.end());
    }
}